

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_loop::run_impl(statement_loop *this)

{
  context_t *c;
  element_type *peVar1;
  _Elt_pointer ppsVar2;
  _Map_pointer pppsVar3;
  _Elt_pointer ppsVar4;
  _Elt_pointer ppsVar5;
  scope_guard scope;
  scope_guard local_98 [13];
  
  peVar1 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->break_block == true) {
    peVar1->break_block = false;
  }
  c = &(this->super_statement_base).context;
  if (peVar1->continue_block == true) {
    peVar1->continue_block = false;
  }
  scope_guard::scope_guard(local_98,c);
  do {
    process_context::poll_event((process_context *)current_process);
    ppsVar4 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
    ppsVar5 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar3 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar2 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    while (ppsVar4 != ppsVar2) {
      statement_base::run(*ppsVar4);
      peVar1 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1->return_fcall != false) {
LAB_0015e3f6:
        scope_guard::~scope_guard(local_98);
        return;
      }
      if (peVar1->break_block == true) {
        peVar1->break_block = false;
        goto LAB_0015e3f6;
      }
      if (peVar1->continue_block != false) {
        peVar1->continue_block = false;
        break;
      }
      ppsVar4 = ppsVar4 + 1;
      if (ppsVar4 == ppsVar5) {
        ppsVar4 = pppsVar3[1];
        pppsVar3 = pppsVar3 + 1;
        ppsVar5 = ppsVar4 + 0x40;
      }
    }
    scope_guard::clear(local_98);
  } while( true );
}

Assistant:

void statement_loop::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		while (true) {
			current_process->poll_event();
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}